

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
               (void)

{
  node_ptr plVar1;
  mapped_type *pmVar2;
  Delete_disposer disposer;
  pointer p;
  node_ptr plVar3;
  pointer p_1;
  pointer p_00;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  m;
  shared_count sStack_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined **local_298;
  undefined1 local_290;
  undefined8 *local_288;
  char **local_280;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_278;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 local_140 [56];
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  local_108 [216];
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>>
            ();
  local_140._0_8_ = operator_new(0x38);
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.ptr = (char *)0x0;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.list.sz = 0;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.requested_size = 0x18;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.next_size = 0x20;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.start_size = 0x20;
  (((Column_settings *)local_140._0_8_)->entryConstructor).entryPool_.
  super_pool<boost::default_user_allocator_malloc_free>.max_size = 0;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
  ::RU_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>
              *)(local_140 + 8),&local_278,(Column_settings *)local_140._0_8_);
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x26d);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_108,(key_type *)&local_298);
  plVar3 = (node_ptr)&pmVar2->column_;
  do {
    plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar3 == (node_ptr)&pmVar2->column_) break;
    if (plVar3 == (node_ptr)0x0) goto LAB_0015f692;
  } while (*(int *)&plVar3[1].next_ != 1);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "!m.is_zero_entry(3, 1)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_168 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x26e);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_108,(key_type *)&local_298);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "!m.is_zero_column(3)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_198 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_108,(key_type *)&local_298);
  p_00 = (pointer)&pmVar2->column_;
  do {
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)&pmVar2->column_) goto LAB_0015f2de;
    if (p_00 == (pointer)0x0) goto LAB_0015f692;
  } while (p_00->rowIndex_ != 1);
  plVar3 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar1 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar1->next_ = plVar3;
  plVar3->prev_ = plVar1;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>
  ::destroy(&pmVar2->entryPool_->entryPool_,p_00);
LAB_0015f2de:
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x270);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_108,(key_type *)&local_298);
  plVar3 = (node_ptr)&pmVar2->column_;
  do {
    plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar3 == (node_ptr)&pmVar2->column_) break;
    if (plVar3 == (node_ptr)0x0) goto LAB_0015f692;
  } while (*(int *)&plVar3[1].next_ != 1);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "m.is_zero_entry(3, 1)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c8 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1e0,0x271);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_108,(key_type *)&local_298);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "!m.is_zero_column(3)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f8 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_298._0_4_ = 3;
  disposer.col_ =
       std::__detail::
       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
       ::at(local_108,(key_type *)&local_298);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)&(disposer.col_)->column_,disposer);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_210,0x273);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  pmVar2 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at(local_108,(key_type *)&local_298);
  plVar3 = (node_ptr)&pmVar2->column_;
  do {
    plVar3 = (((type *)&plVar3->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar3 == (node_ptr)&pmVar2->column_) break;
    if (plVar3 == (node_ptr)0x0) {
LAB_0015f692:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<RU_rep_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, true, false, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&plVar3[1].next_ != 1);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "m.is_zero_entry(3, 1)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_228 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_240,0x274);
  local_298 = (undefined **)CONCAT44(local_298._4_4_,3);
  std::__detail::
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(local_108,(key_type *)&local_298);
  sStack_2b0.pi_ = (sp_counted_base *)0x0;
  local_2a8 = "m.is_zero_column(3)";
  local_2a0 = "";
  local_290 = 0;
  local_298 = &PTR__lazy_ostream_001d92e8;
  local_288 = &boost::unit_test::lazy_ostream::inst;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_258 = "";
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2b0);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
  ::~Matrix((Matrix<RU_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_false>_>
             *)local_140);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_278);
  return;
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}